

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O2

void trun::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *strings,char *strInput,int splitChar)

{
  size_type sVar1;
  size_type sStack_b0;
  allocator<char> local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  string str;
  string input;
  string local_50;
  
  local_98 = strings;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,strInput,(allocator<char> *)&str);
  sStack_b0 = 0;
  while (sStack_b0 != 0xffffffffffffffff) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&input,(char)splitChar,sStack_b0);
    if (sVar1 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&str,&input,sStack_b0,input._M_string_length - sStack_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"\t\n\v\f\r ",&local_99);
      trim(&str,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (str._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_98,&str);
      }
      std::__cxx11::string::~string((string *)&str);
      sStack_b0 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&str,&input,sStack_b0,sVar1 - sStack_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"\t\n\v\f\r ",&local_99);
      trim(&str,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (str._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_98,&str);
      }
      sStack_b0 = sVar1 + 1;
      std::__cxx11::string::~string((string *)&str);
    }
  }
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

void split(std::vector<std::string> &strings, const char *strInput, int splitChar) {
      std::string input(strInput);
      size_t iPos = 0;
      while(iPos != std::string::npos)
      {
          size_t iStart = iPos;
          iPos = input.find(splitChar,iPos);
          if (iPos != std::string::npos)
          {
              std::string str = input.substr(iStart, iPos-iStart);
              trim(str);
              if (str.length() > 0) {
                strings.push_back(str);
              }
              iPos++;
          } else
          {
              std::string str = input.substr(iStart, input.length()-iStart);
              trim(str);
              if (str.length() > 0) {
                strings.push_back(str);
              }
          }
      }
    }